

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_cpy_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  int64_t iVar1;
  int64_t iVar2;
  ggml_tensor *tensor;
  size_t sVar3;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  
  iVar1 = ggml_nelements(in_RSI);
  iVar2 = ggml_nelements(in_RDX);
  if (iVar1 != iVar2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xb8c,"GGML_ASSERT(%s) failed","ggml_nelements(a) == ggml_nelements(b)");
  }
  tensor = ggml_view_tensor((ggml_context *)in_RSI,in_RDX);
  sVar3 = strlen(in_RDX->name);
  if (sVar3 == 0) {
    ggml_format_name(tensor,"%s (copy)",in_RSI->name);
  }
  else {
    ggml_format_name(tensor,"%s (copy of %s)",in_RDX->name,in_RSI->name);
  }
  tensor->op = GGML_OP_CPY;
  tensor->src[0] = in_RSI;
  tensor->src[1] = in_RDX;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_cpy_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_nelements(a) == ggml_nelements(b));

    // make a view of the destination
    struct ggml_tensor * result = ggml_view_tensor(ctx, b);
    if (strlen(b->name) > 0) {
        ggml_format_name(result, "%s (copy of %s)", b->name, a->name);
    } else {
        ggml_format_name(result, "%s (copy)", a->name);
    }

    result->op     = GGML_OP_CPY;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}